

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

void __thiscall jsonnet::internal::Desugarer::desugar(Desugarer *this,AST **ast_,uint obj_level)

{
  uint *ast__00;
  pointer *ast__01;
  pointer *params;
  int iVar1;
  UString *s;
  AST **ppAVar2;
  pointer pCVar3;
  undefined1 *puVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  ArrayComprehension *ast;
  AST *pAVar8;
  pointer pFVar9;
  LiteralString *pLVar10;
  Object *ast_00;
  ObjectComprehension *ast_01;
  Index *pIVar11;
  Identifier *ident;
  Var *pVVar12;
  undefined8 uVar13;
  LiteralNull *pLVar14;
  pointer pbVar15;
  Apply *pAVar16;
  Function *pFVar17;
  Conditional *pCVar18;
  ostream *poVar19;
  StaticError *this_00;
  ArgParam *this_01;
  ComprehensionSpec *spec;
  pointer pCVar20;
  pointer *args_5;
  Field *field;
  AST **ppAVar21;
  long lVar22;
  long *plVar23;
  initializer_list<jsonnet::internal::ArgParam> __l;
  initializer_list<jsonnet::internal::ArgParam> __l_00;
  bool local_211;
  LocationRange *local_210;
  bool local_204;
  bool local_203;
  allocator_type local_202;
  allocator<char32_t> local_201;
  Index *local_200;
  ArgParam local_1f8;
  void *local_1a0;
  LiteralString *local_198;
  ArgParam local_190 [4];
  
  local_210 = (LocationRange *)CONCAT44(local_210._4_4_,obj_level + 1);
LAB_001de45b:
  do {
    pAVar8 = *ast_;
    if (pAVar8 == (AST *)0x0) {
LAB_001df253:
      poVar19 = ::std::operator<<((ostream *)&::std::cerr,"INTERNAL ERROR: Unknown AST: ");
      poVar19 = (ostream *)::std::ostream::operator<<(poVar19,*ast_);
      ::std::endl<char,std::char_traits<char>>(poVar19);
      abort();
    }
    lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Apply::typeinfo,0);
    if (lVar7 != 0) {
      desugar(this,(AST **)(lVar7 + 0x80),obj_level);
      lVar22 = *(long *)(lVar7 + 0xa8);
      for (lVar7 = *(long *)(lVar7 + 0xa0); lVar7 != lVar22; lVar7 = lVar7 + 0x58) {
        desugar(this,(AST **)(lVar7 + 0x38),obj_level);
      }
      return;
    }
    lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    if (lVar7 != 0) {
      desugar(this,(AST **)(lVar7 + 0x80),obj_level);
      desugar(this,(AST **)(lVar7 + 0x88),obj_level);
      local_190[0].idFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_190[0].idFodder.
                             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
      pCVar18 = (Conditional *)
                make<jsonnet::internal::Binary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                          (this,(LocationRange *)(lVar7 + 8),
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)(lVar7 + 0x50),(AST **)(lVar7 + 0x80),
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,(BinaryOp *)local_190,(AST **)(lVar7 + 0x88));
      goto LAB_001dead6;
    }
    lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Array::typeinfo,0);
    if (lVar7 != 0) {
      ppAVar2 = *(AST ***)(lVar7 + 0x88);
      for (ppAVar21 = *(AST ***)(lVar7 + 0x80); ppAVar21 != ppAVar2; ppAVar21 = ppAVar21 + 4) {
        desugar(this,ppAVar21,obj_level);
      }
      return;
    }
    ast = (ArrayComprehension *)
          __dynamic_cast(pAVar8,&AST::typeinfo,&ArrayComprehension::typeinfo,0);
    if (ast != (ArrayComprehension *)0x0) {
      pCVar3 = (ast->specs).
               super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar20 = (ast->specs).
                     super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                     ._M_impl.super__Vector_impl_data._M_start; pCVar20 != pCVar3;
          pCVar20 = pCVar20 + 1) {
        desugar(this,&pCVar20->expr,obj_level);
      }
      desugar(this,&ast->body,(uint)local_210);
      pCVar18 = (Conditional *)makeArrayComprehension(this,ast);
LAB_001dead6:
      *ast_ = &pCVar18->super_AST;
      return;
    }
    lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Assert::typeinfo,0);
    if (lVar7 != 0) {
      desugar(this,(AST **)(lVar7 + 0x80),obj_level);
      ppAVar21 = (AST **)(lVar7 + 0xa0);
      if (*(long *)(lVar7 + 0xa0) == 0) {
        ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                  ((u32string *)local_190,L"Assertion failed.",(allocator<char32_t> *)&local_1f8);
        pLVar10 = str(this,(UString *)local_190);
        *ppAVar21 = &pLVar10->super_AST;
        ::std::__cxx11::u32string::~u32string((u32string *)local_190);
      }
      desugar(this,ppAVar21,obj_level);
      local_210 = (LocationRange *)ppAVar21;
      desugar(this,(AST **)(lVar7 + 0xc0),obj_level);
      local_190[0].idFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)make<jsonnet::internal::Error,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                              (this,(LocationRange *)(lVar7 + 8),
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(AST **)local_210);
      pCVar18 = make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                          (this,(LocationRange *)(lVar7 + 8),
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)(lVar7 + 0x50),(AST **)(lVar7 + 0x80),
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,(AST **)(lVar7 + 0xc0),
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,(AST **)local_190);
      goto LAB_001dead6;
    }
    lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Binary::typeinfo,0);
    if (lVar7 != 0) {
      desugar(this,(AST **)(lVar7 + 0x80),obj_level);
      desugar(this,(AST **)(lVar7 + 0xa8),obj_level);
      iVar1 = *(int *)(lVar7 + 0xa0);
      if (iVar1 == 0xd) {
        bVar6 = true;
      }
      else {
        if (iVar1 != 0xc) {
          if (iVar1 != 2) {
            return;
          }
          local_1f8.idFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)std(this);
          local_1f8.eqFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_1f8.eqFodder.
                                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                    ((u32string *)local_190,L"mod",(allocator<char32_t> *)&local_1a0);
          local_200 = (Index *)str(this,(UString *)local_190);
          local_1f8.eqFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_198 = (LiteralString *)0x0;
          pIVar11 = make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                              (this,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Var **)&local_1f8,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(bool *)&local_1f8.eqFodder,(LiteralString **)&local_200,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(pointer *)
                                     ((long)&local_1f8.eqFodder.
                                             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                             ._M_impl.super__Vector_impl_data + 8),
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,&local_198,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF);
          ::std::__cxx11::u32string::~u32string((u32string *)local_190);
          local_1f8.commaFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar11;
          ArgParam::ArgParam(local_190,*(AST **)(lVar7 + 0x80),(Fodder *)EF);
          ArgParam::ArgParam(local_190 + 1,*(AST **)(lVar7 + 0xa8),(Fodder *)EF);
          __l._M_len = 2;
          __l._M_array = local_190;
          ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)&local_1f8,__l,(allocator_type *)&local_200);
          lVar22 = 0x58;
          do {
            ArgParam::~ArgParam((ArgParam *)
                                ((long)&local_190[0].idFodder.
                                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar22));
            lVar22 = lVar22 + -0x58;
          } while (lVar22 != -0x58);
          local_190[0].idFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_190[0].idFodder.
                                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          local_200 = (Index *)((ulong)local_200 & 0xffffffffffffff00);
          pAVar16 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                              (this,(LocationRange *)(lVar7 + 8),
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)(lVar7 + 0x50),(AST **)&local_1f8.commaFodder,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                      *)&local_1f8,(bool *)local_190,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,(bool *)&local_200);
          *ast_ = &pAVar16->super_AST;
          ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                   *)&local_1f8);
          return;
        }
        bVar6 = false;
      }
      pAVar16 = equals(this,(LocationRange *)(lVar7 + 8),*(AST **)(lVar7 + 0x80),
                       *(AST **)(lVar7 + 0xa8));
      *ast_ = &pAVar16->super_AST;
      if (!bVar6) {
        return;
      }
      local_190[0].idFodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_190[0].idFodder.
                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      pCVar18 = (Conditional *)
                make<jsonnet::internal::Unary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::UnaryOp,jsonnet::internal::AST*&>
                          (this,(LocationRange *)(lVar7 + 8),
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)(lVar7 + 0x50),(UnaryOp *)local_190,ast_);
      goto LAB_001dead6;
    }
    lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
    if (lVar7 != 0) {
      return;
    }
    lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Conditional::typeinfo,0);
    if (lVar7 == 0) {
      lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Dollar::typeinfo,0);
      if (lVar7 != 0) {
        if (obj_level == 0) {
          this_00 = (StaticError *)__cxa_allocate_exception(0x60);
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_190,"No top-level object found.",(allocator<char> *)&local_1f8)
          ;
          StaticError::StaticError(this_00,(LocationRange *)(lVar7 + 8),(string *)local_190);
          __cxa_throw(this_00,&StaticError::typeinfo,StaticError::~StaticError);
        }
        ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                  ((u32string *)local_190,L"$",(allocator<char32_t> *)&local_1f8);
        ident = id(this,(UString *)local_190);
        pVVar12 = var(this,ident);
        *ast_ = &pVVar12->super_AST;
        this_01 = local_190;
        goto LAB_001decd9;
      }
      lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Error::typeinfo,0);
      if (lVar7 == 0) {
        lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Function::typeinfo,0);
        if (lVar7 != 0) {
          desugar(this,(AST **)(lVar7 + 0xd0),obj_level);
          desugarParams(this,(ArgParams *)(lVar7 + 0x98),obj_level);
          return;
        }
        lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Import::typeinfo,0);
        if (lVar7 != 0) {
          local_190[0].idFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar7 + 0x80);
          desugar(this,(AST **)local_190,obj_level);
joined_r0x001ded9c:
          if (local_190[0].idFodder.
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
            uVar13 = 0;
          }
          else {
            uVar13 = __dynamic_cast(local_190[0].idFodder.
                                    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start,&AST::typeinfo,
                                    &LiteralString::typeinfo,0);
          }
          *(undefined8 *)(lVar7 + 0x80) = uVar13;
          return;
        }
        lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Importstr::typeinfo,0);
        if (lVar7 != 0) {
          local_190[0].idFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar7 + 0x80);
          desugar(this,(AST **)local_190,obj_level);
          goto joined_r0x001ded9c;
        }
        lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Importbin::typeinfo,0);
        if (lVar7 != 0) {
          local_190[0].idFodder.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(lVar7 + 0x80);
          desugar(this,(AST **)local_190,obj_level);
          goto joined_r0x001ded9c;
        }
        lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&InSuper::typeinfo,0);
        if (lVar7 == 0) {
          pFVar9 = (pointer)__dynamic_cast(pAVar8,&AST::typeinfo,&Index::typeinfo,0);
          if (pFVar9 != (pointer)0x0) {
            desugar(this,(AST **)&pFVar9[3].indent,obj_level);
            if ((char)pFVar9[4].kind == INTERSTITIAL) {
              ast__00 = &pFVar9[4].indent;
              if (*(long *)&pFVar9[4].indent == 0) {
                pLVar14 = null(this);
                *(LiteralNull **)ast__00 = pLVar14;
              }
              local_210 = (LocationRange *)ast__00;
              desugar(this,(AST **)ast__00,obj_level);
              local_1f8.expr = (AST *)(pFVar9 + 5);
              lVar7._0_4_ = pFVar9[5].kind;
              lVar7._4_4_ = pFVar9[5].blanks;
              if (lVar7 == 0) {
                pAVar8 = &null(this)->super_AST;
                (local_1f8.expr)->_vptr_AST = (_func_int **)pAVar8;
              }
              desugar(this,(AST **)local_1f8.expr,obj_level);
              ast__01 = &pFVar9[5].comment.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_1f8.eqFodder.
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar9;
              if (pFVar9[5].comment.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                pbVar15 = (pointer)null(this);
                *ast__01 = pbVar15;
              }
              desugar(this,(AST **)ast__01,obj_level);
              local_1f8.eqFodder.
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)std(this);
              local_211 = false;
              ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
                        ((u32string *)&local_1f8,L"slice",&local_201);
              local_198 = str(this,(UString *)&local_1f8);
              local_1f8.eqFodder.
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a0 = (void *)0x0;
              local_200 = make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                                    (this,(LocationRange *)E,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,(Var **)((long)&local_1f8.eqFodder.
                                                                                                                      
                                                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                                  ._M_impl.super__Vector_impl_data + 8),
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,&local_211,&local_198,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,(void **)&local_1f8.eqFodder,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF,&local_1a0,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)EF);
              ArgParam::ArgParam(local_190,*(AST **)&pFVar9[3].indent,(Fodder *)EF);
              ArgParam::ArgParam(local_190 + 1,*(AST **)local_210,(Fodder *)EF);
              ArgParam::ArgParam(local_190 + 2,(AST *)(local_1f8.expr)->_vptr_AST,(Fodder *)EF);
              ArgParam::ArgParam(local_190 + 3,(AST *)*ast__01,(Fodder *)EF);
              __l_00._M_len = 4;
              __l_00._M_array = local_190;
              ::std::
              vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
              vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                      *)&local_1f8.commaFodder,__l_00,&local_202);
              local_203 = false;
              local_204 = false;
              pAVar16 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                                  (this,(LocationRange *)
                                        &(local_1f8.eqFodder.
                                          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         indent,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,&local_200,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                          *)&local_1f8.commaFodder,&local_203,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                          *)EF,&local_204);
              *ast_ = &pAVar16->super_AST;
              ::std::
              vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
              ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                       *)&local_1f8.commaFodder);
              lVar7 = 0x108;
              do {
                ArgParam::~ArgParam((ArgParam *)
                                    ((long)&local_190[0].idFodder.
                                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar7));
                lVar7 = lVar7 + -0x58;
              } while (lVar7 != -0x58);
              this_01 = &local_1f8;
LAB_001decd9:
              ::std::__cxx11::u32string::~u32string((u32string *)this_01);
              return;
            }
            s = (UString *)
                pFVar9[6].comment.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
            if (s != (UString *)0x0) {
              if (*(long *)&pFVar9[4].indent != 0) {
                __assert_fail("ast->index == nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                              ,0x33a,
                              "void jsonnet::internal::Desugarer::desugar(AST *&, unsigned int)");
              }
              pLVar10 = str(this,s);
              *(LiteralString **)&pFVar9[4].indent = pLVar10;
              pFVar9[6].comment.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            }
            ast_ = (AST **)&pFVar9[4].indent;
            goto LAB_001de45b;
          }
          lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Local::typeinfo,0);
          if (lVar7 != 0) {
            lVar5 = *(long *)(lVar7 + 0x88);
            for (lVar22 = *(long *)(lVar7 + 0x80); lVar22 != lVar5; lVar22 = lVar22 + 0xb0) {
              desugar(this,(AST **)(lVar22 + 0x38),obj_level);
            }
            desugar(this,(AST **)(lVar7 + 0x98),obj_level);
            puVar4 = *(undefined1 **)(lVar7 + 0x88);
            local_210 = (LocationRange *)(lVar7 + 8);
            for (args_5 = (pointer *)(*(long *)(lVar7 + 0x80) + 0x80);
                args_5 + -0x10 != (pointer *)puVar4; args_5 = args_5 + 0x16) {
              if (*(char *)(args_5 + -8) == '\x01') {
                params = args_5 + -4;
                desugarParams(this,(ArgParams *)params,obj_level);
                local_190[0].idFodder.
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)((ulong)local_190[0].idFodder.
                                      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00
                              );
                pFVar17 = make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                                    (this,local_210,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)(lVar7 + 0x50),
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)(args_5 + -7),
                                     (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                      *)params,(bool *)local_190,
                                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                      *)args_5,(AST **)(args_5 + -9));
                (((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)(args_5 + -9))->
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                )._M_impl.super__Vector_impl_data._M_start = (pointer)pFVar17;
                *(undefined1 *)(args_5 + -8) = 0;
                ::std::
                vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
                clear((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                       *)params);
              }
            }
            return;
          }
          lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&LiteralBoolean::typeinfo,0);
          if (lVar7 != 0) {
            return;
          }
          lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&LiteralNumber::typeinfo,0);
          if (lVar7 != 0) {
            return;
          }
          lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&LiteralString::typeinfo,0);
          if (lVar7 != 0) {
            if (3 < *(int *)(lVar7 + 0xa0) - 2U) {
              jsonnet_string_unescape
                        ((UString *)local_190,(LocationRange *)(lVar7 + 8),
                         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(lVar7 + 0x80));
              ::std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
              operator=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)(lVar7 + 0x80),
                        (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)local_190);
              ::std::__cxx11::u32string::~u32string((u32string *)local_190);
            }
            *(undefined4 *)(lVar7 + 0xa0) = 5;
            *(undefined8 *)(lVar7 + 0xb0) = 0;
            **(undefined1 **)(lVar7 + 0xa8) = 0;
            return;
          }
          lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&LiteralNull::typeinfo,0);
          if (lVar7 != 0) {
            return;
          }
          lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&DesugaredObject::typeinfo,0);
          if (lVar7 != 0) {
            lVar5 = *(long *)(lVar7 + 0xa0);
            for (lVar22 = *(long *)(lVar7 + 0x98); lVar22 != lVar5; lVar22 = lVar22 + 0x18) {
              desugar(this,(AST **)(lVar22 + 8),obj_level);
              desugar(this,(AST **)(lVar22 + 0x10),(uint)local_210);
            }
            plVar23 = (long *)(lVar7 + 0x80);
            while (plVar23 = (long *)*plVar23, plVar23 != (long *)(lVar7 + 0x80)) {
              local_190[0].idFodder.
              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar23[2];
              desugar(this,(AST **)local_190,(uint)local_210);
            }
            return;
          }
          ast_00 = (Object *)__dynamic_cast(pAVar8,&AST::typeinfo,&Object::typeinfo,0);
          if (ast_00 != (Object *)0x0) {
            pCVar18 = (Conditional *)makeObject(this,ast_00,obj_level);
            goto LAB_001dead6;
          }
          ast_01 = (ObjectComprehension *)
                   __dynamic_cast(pAVar8,&AST::typeinfo,&ObjectComprehension::typeinfo,0);
          if (ast_01 != (ObjectComprehension *)0x0) {
            pCVar18 = (Conditional *)makeObjectComprehension(this,ast_01,obj_level);
            goto LAB_001dead6;
          }
          lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0);
          if (lVar7 == 0) {
            lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Parens::typeinfo,0);
            if (lVar7 != 0) {
              desugar(this,(AST **)(lVar7 + 0x80),obj_level);
              pCVar18 = *(Conditional **)(lVar7 + 0x80);
              goto LAB_001dead6;
            }
            lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Self::typeinfo,0);
            if (lVar7 != 0) {
              return;
            }
            lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&SuperIndex::typeinfo,0);
            if (lVar7 == 0) {
              lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Unary::typeinfo,0);
              if (lVar7 == 0) {
                lVar7 = __dynamic_cast(pAVar8,&AST::typeinfo,&Var::typeinfo,0);
                if (lVar7 != 0) {
                  return;
                }
                goto LAB_001df253;
              }
              ast_ = (AST **)(lVar7 + 0x88);
              goto LAB_001de45b;
            }
            if (*(UString **)(lVar7 + 0xb8) != (UString *)0x0) {
              if (*(long *)(lVar7 + 0x98) != 0) {
                __assert_fail("ast->index == nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                              ,0x386,
                              "void jsonnet::internal::Desugarer::desugar(AST *&, unsigned int)");
              }
              pLVar10 = str(this,*(UString **)(lVar7 + 0xb8));
              *(LiteralString **)(lVar7 + 0x98) = pLVar10;
              *(undefined8 *)(lVar7 + 0xb8) = 0;
            }
          }
          else {
            desugar(this,(AST **)(lVar7 + 0x80),obj_level);
            desugar(this,(AST **)(lVar7 + 0x88),(uint)local_210);
          }
          ast_ = (AST **)(lVar7 + 0x98);
          goto LAB_001de45b;
        }
      }
      ast_ = (AST **)(lVar7 + 0x80);
      goto LAB_001de45b;
    }
    desugar(this,(AST **)(lVar7 + 0x80),obj_level);
    desugar(this,(AST **)(lVar7 + 0xa0),obj_level);
    ast_ = (AST **)(lVar7 + 0xc0);
    if (*(long *)(lVar7 + 0xc0) == 0) {
      pAVar8 = &null(this)->super_AST;
      *ast_ = pAVar8;
    }
  } while( true );
}

Assistant:

void desugar(AST *&ast_, unsigned obj_level)
    {
        if (auto *ast = dynamic_cast<Apply *>(ast_)) {
            desugar(ast->target, obj_level);
            for (ArgParam &arg : ast->args)
                desugar(arg.expr, obj_level);

        } else if (auto *ast = dynamic_cast<ApplyBrace *>(ast_)) {
            desugar(ast->left, obj_level);
            desugar(ast->right, obj_level);
            ast_ =
                make<Binary>(ast->location, ast->openFodder, ast->left, EF, BOP_PLUS, ast->right);

        } else if (auto *ast = dynamic_cast<Array *>(ast_)) {
            for (auto &el : ast->elements)
                desugar(el.expr, obj_level);

        } else if (auto *ast = dynamic_cast<ArrayComprehension *>(ast_)) {
            for (ComprehensionSpec &spec : ast->specs)
                desugar(spec.expr, obj_level);
            desugar(ast->body, obj_level + 1);

            ast_ = makeArrayComprehension(ast);

        } else if (auto *ast = dynamic_cast<Assert *>(ast_)) {
            desugar(ast->cond, obj_level);
            if (ast->message == nullptr) {
                ast->message = str(U"Assertion failed.");
            }
            desugar(ast->message, obj_level);
            desugar(ast->rest, obj_level);

            // if cond then rest else error msg
            AST *branch_false = make<Error>(ast->location, EF, ast->message);
            ast_ = make<Conditional>(
                ast->location, ast->openFodder, ast->cond, EF, ast->rest, EF, branch_false);

        } else if (auto *ast = dynamic_cast<Binary *>(ast_)) {
            desugar(ast->left, obj_level);
            desugar(ast->right, obj_level);

            bool invert = false;

            switch (ast->op) {
                case BOP_PERCENT: {
                    AST *f_mod = make<Index>(
                        E, EF, std(), EF, false, str(U"mod"), EF, nullptr, EF, nullptr, EF);
                    ArgParams args = {{ast->left, EF}, {ast->right, EF}};
                    ast_ = make<Apply>(
                        ast->location, ast->openFodder, f_mod, EF, args, false, EF, EF, false);
                } break;

                case BOP_MANIFEST_UNEQUAL: invert = true;
                [[fallthrough]];
                case BOP_MANIFEST_EQUAL: {
                    ast_ = equals(ast->location, ast->left, ast->right);
                    if (invert)
                        ast_ = make<Unary>(ast->location, ast->openFodder, UOP_NOT, ast_);
                } break;

                default:;
                    // Otherwise don't change it.
            }

        } else if (dynamic_cast<const BuiltinFunction *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<Conditional *>(ast_)) {
            desugar(ast->cond, obj_level);
            desugar(ast->branchTrue, obj_level);
            if (ast->branchFalse == nullptr)
                ast->branchFalse = null();
            desugar(ast->branchFalse, obj_level);

        } else if (auto *ast = dynamic_cast<Dollar *>(ast_)) {
            if (obj_level == 0) {
                throw StaticError(ast->location, "No top-level object found.");
            }
            ast_ = var(id(U"$"));

        } else if (auto *ast = dynamic_cast<Error *>(ast_)) {
            desugar(ast->expr, obj_level);

        } else if (auto *ast = dynamic_cast<Function *>(ast_)) {
            desugar(ast->body, obj_level);
            desugarParams(ast->params, obj_level);

        } else if (auto *ast = dynamic_cast<Import *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<Importstr *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<Importbin *>(ast_)) {
            // TODO(dcunnin): Abstract this into a template function if it becomes more common.
            AST *file = ast->file;
            desugar(file, obj_level);
            ast->file = dynamic_cast<LiteralString *>(file);

        } else if (auto *ast = dynamic_cast<InSuper *>(ast_)) {
            desugar(ast->element, obj_level);

        } else if (auto *ast = dynamic_cast<Index *>(ast_)) {
            desugar(ast->target, obj_level);
            if (ast->isSlice) {
                if (ast->index == nullptr)
                    ast->index = null();
                desugar(ast->index, obj_level);

                if (ast->end == nullptr)
                    ast->end = null();
                desugar(ast->end, obj_level);

                if (ast->step == nullptr)
                    ast->step = null();
                desugar(ast->step, obj_level);

                ast_ = make<Apply>(
                    ast->location,
                    EF,
                    make<Index>(
                        E, EF, std(), EF, false, str(U"slice"), EF, nullptr, EF, nullptr, EF),
                    EF,
                    ArgParams{
                        {ast->target, EF},
                        {ast->index, EF},
                        {ast->end, EF},
                        {ast->step, EF},
                    },
                    false,  // trailing comma
                    EF,
                    EF,
                    false  // tailstrict
                );
            } else {
                if (ast->id != nullptr) {
                    assert(ast->index == nullptr);
                    ast->index = str(ast->id->name);
                    ast->id = nullptr;
                }
                desugar(ast->index, obj_level);
            }

        } else if (auto *ast = dynamic_cast<Local *>(ast_)) {
            for (auto &bind : ast->binds)
                desugar(bind.body, obj_level);
            desugar(ast->body, obj_level);

            for (auto &bind : ast->binds) {
                if (bind.functionSugar) {
                    desugarParams(bind.params, obj_level);
                    bind.body = make<Function>(ast->location,
                                               ast->openFodder,
                                               bind.parenLeftFodder,
                                               bind.params,
                                               false,
                                               bind.parenRightFodder,
                                               bind.body);
                    bind.functionSugar = false;
                    bind.params.clear();
                }
            }

        } else if (dynamic_cast<const LiteralBoolean *>(ast_)) {
            // Nothing to do.

        } else if (dynamic_cast<const LiteralNumber *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<LiteralString *>(ast_)) {
            if ((ast->tokenKind != LiteralString::RAW_DESUGARED) &&
                (ast->tokenKind != LiteralString::BLOCK) &&
                (ast->tokenKind != LiteralString::VERBATIM_DOUBLE) &&
                (ast->tokenKind != LiteralString::VERBATIM_SINGLE)) {
                ast->value = jsonnet_string_unescape(ast->location, ast->value);
            }
            ast->tokenKind = LiteralString::RAW_DESUGARED;
            ast->blockIndent.clear();

        } else if (dynamic_cast<const LiteralNull *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<DesugaredObject *>(ast_)) {
            for (auto &field : ast->fields) {
                desugar(field.name, obj_level);
                desugar(field.body, obj_level + 1);
            }
            for (AST *assert : ast->asserts) {
                desugar(assert, obj_level + 1);
            }

        } else if (auto *ast = dynamic_cast<Object *>(ast_)) {
            ast_ = makeObject(ast, obj_level);

        } else if (auto *ast = dynamic_cast<ObjectComprehension *>(ast_)) {
            ast_ = makeObjectComprehension(ast, obj_level);

        } else if (auto *ast = dynamic_cast<ObjectComprehensionSimple *>(ast_)) {
            desugar(ast->field, obj_level);
            desugar(ast->value, obj_level + 1);
            desugar(ast->array, obj_level);

        } else if (auto *ast = dynamic_cast<Parens *>(ast_)) {
            // Strip parens.
            desugar(ast->expr, obj_level);
            ast_ = ast->expr;

        } else if (dynamic_cast<const Self *>(ast_)) {
            // Nothing to do.

        } else if (auto *ast = dynamic_cast<SuperIndex *>(ast_)) {
            if (ast->id != nullptr) {
                assert(ast->index == nullptr);
                ast->index = str(ast->id->name);
                ast->id = nullptr;
            }
            desugar(ast->index, obj_level);

        } else if (auto *ast = dynamic_cast<Unary *>(ast_)) {
            desugar(ast->expr, obj_level);

        } else if (dynamic_cast<const Var *>(ast_)) {
            // Nothing to do.

        } else {
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
        }
    }